

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint64_t mpidr_read_val(CPUARMState_conflict *env)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = *(ulong *)&env[1].spsr;
  if ((env->features & 0x1000) != 0) {
    uVar2 = 0xc0000000;
    if (*(char *)((long)env[1].xregs + 0x2c) == '\0') {
      uVar2 = 0x80000000;
    }
    uVar1 = uVar1 | uVar2;
  }
  return uVar1;
}

Assistant:

static uint64_t mpidr_read_val(CPUARMState *env)
{
    ARMCPU *cpu = env_archcpu(env);
    uint64_t mpidr = cpu->mp_affinity;

    if (arm_feature(env, ARM_FEATURE_V7MP)) {
        mpidr |= (1U << 31);
        /* Cores which are uniprocessor (non-coherent)
         * but still implement the MP extensions set
         * bit 30. (For instance, Cortex-R5).
         */
        if (cpu->mp_is_up) {
            mpidr |= (1u << 30);
        }
    }
    return mpidr;
}